

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

void SstInternalProvideTimestep
               (SstStream Stream,SstData LocalMetadata,SstData Data,ssize_t Timestep,
               FFSFormatList Formats,DataFreeFunc FreeTimestep,void *FreeClientData,
               SstData AttributeData,DataFreeFunc FreeAttributeData,void *FreeAttributelientData)

{
  FFSFormatBlock **ppFVar1;
  size_t *psVar2;
  pthread_mutex_t *__mutex;
  undefined8 *puVar3;
  StreamStatus SVar4;
  WS_ReaderInfo *pp_Var5;
  undefined4 *puVar6;
  ReleaseRecPtr p_Var7;
  CP_DP_WSR_ReadPatternLockedFunc p_Var8;
  size_t sVar9;
  StepRequest __ptr;
  SstData p_Var10;
  SstPreloadModeType SVar11;
  ssize_t sVar12;
  FFSFormatList tmp;
  _TimestepMetadataMsg *RS_StreamPtr;
  CPTimestepList Entry;
  FFSFormatBlock *pFVar13;
  void **__ptr_00;
  ReturnMetadataInfo Metadata;
  FFSFormatList pFVar14;
  undefined4 *puVar15;
  void *pvVar16;
  WS_ReaderInfo p_Var17;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar18;
  WS_ReaderInfo extraout_RDX;
  WS_ReaderInfo extraout_RDX_00;
  long lVar19;
  long lVar20;
  int iVar21;
  RegisterQueue p_Var22;
  uint uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  void *DP_TimestepInfo;
  void *data_block2;
  StreamStatus LocalStatus;
  void *data_block1;
  _MetadataPlusDPInfo Md;
  void *local_d8;
  void *local_d0;
  undefined8 local_c8;
  ssize_t sStack_c0;
  ssize_t local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  _SstData *p_Stack_a0;
  _SstData *local_98;
  void *pvStack_90;
  ulong local_88;
  _ReleaseRec *p_Stack_80;
  undefined8 local_78;
  _ReleaseRec *p_Stack_70;
  ulong local_68;
  void *pvStack_60;
  void *local_58;
  SstData local_50;
  SstData local_48;
  FFSFormatList local_40;
  void *local_38;
  
  RS_StreamPtr = (_TimestepMetadataMsg *)calloc(1,0x38);
  local_d8 = (void *)0x0;
  Entry = (CPTimestepList)calloc(1,0x70);
  __mutex = &Stream->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  Stream->WriterTimestep = Timestep;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  (*Stream->DP_Interface->provideTimestep)
            (&Svcs,Stream->DP_Stream,Data,LocalMetadata,Timestep,&local_d8);
  pFVar13 = Formats;
  if (Formats != (FFSFormatList)0x0) {
    do {
      ppFVar1 = &pFVar13->Next;
      pFVar13 = *ppFVar1;
    } while (*ppFVar1 != (FFSFormatBlock *)0x0);
  }
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  local_48 = AttributeData;
  local_38 = local_d8;
  local_50 = LocalMetadata;
  local_40 = Formats;
  if (_perfstubs_initialized == 1 && Data != (SstData)0x0) {
    if (SstInternalProvideTimestep::__var2102 == (void *)0x0) {
      SstInternalProvideTimestep::__var2102 = (void *)ps_create_counter_("Timestep local data size")
      ;
    }
    ps_sample_counter_(SUB84(((double)CONCAT44(0x45300000,(int)(Data->DataSize >> 0x20)) -
                             1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)Data->DataSize) - 4503599627370496.0)
                             ,0),SstInternalProvideTimestep::__var2102);
  }
  if ((LocalMetadata != (SstData)0x0) && (_perfstubs_initialized == 1)) {
    if (SstInternalProvideTimestep::__var2106 == (void *)0x0) {
      SstInternalProvideTimestep::__var2106 =
           (void *)ps_create_counter_("Timestep local metadata size");
    }
    ps_sample_counter_(SUB84(((double)CONCAT44(0x45300000,(int)(LocalMetadata->DataSize >> 0x20)) -
                             1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)LocalMetadata->DataSize) -
                             4503599627370496.0),0),SstInternalProvideTimestep::__var2106);
  }
  Stream->LastProvidedTimestep = Timestep;
  if ((Timestep == 0) && (Stream->ConfigParams->FirstTimestepPrecious != 0)) {
    Entry->PreciousTimestep = 1;
  }
  Entry->ReferenceCount = 1;
  Entry->DPRegistered = 1;
  Entry->Timestep = Timestep;
  Entry->Msg = RS_StreamPtr;
  Entry->MetadataArray = RS_StreamPtr->Metadata;
  Entry->DP_TimestepInfo = RS_StreamPtr->DP_TimestepInfo;
  Entry->FreeTimestep = FreeTimestep;
  Entry->FreeClientData = FreeClientData;
  Entry->Next = Stream->QueuedTimesteps;
  Entry->InProgressFlag = 1;
  Stream->QueuedTimesteps = Entry;
  Stream->QueuedTimestepCount = Stream->QueuedTimestepCount + 1;
  psVar2 = &(Stream->Stats).TimestepsCreated;
  *psVar2 = *psVar2 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (_perfstubs_initialized == 1) {
    if (SstInternalProvideTimestep::timerMD == (void *)0x0) {
      SstInternalProvideTimestep::timerMD =
           (void *)ps_timer_create_("Metadata Consolidation time in EndStep()");
    }
    ps_timer_start_(SstInternalProvideTimestep::timerMD);
  }
  __ptr_00 = CP_consolidateDataToRankZero
                       (Stream,&local_50,Stream->CPInfo->PerRankMetadataFormat,&local_58);
  if (Stream->Rank == 0) {
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    p_Var22 = Stream->ReaderRegisterQueue;
    QueueMaintenance(Stream);
    if (Stream->QueueFullPolicy == SstQueueFullDiscard) {
      CP_verbose(Stream,TraceVerbose,
                 "Testing Discard Condition, Queued Timestep Count %d, QueueLimit %d\n",
                 (ulong)(uint)Stream->QueuedTimestepCount,(ulong)(uint)Stream->QueueLimit);
      QueueMaintenance(Stream);
      uVar23 = (uint)(Stream->QueueLimit < Stream->QueuedTimestepCount);
    }
    else {
      iVar21 = Stream->QueueLimit;
      if (iVar21 < 1) {
LAB_0073025a:
        uVar23 = 0;
      }
      else {
        uVar23 = 0;
        do {
          if (Stream->QueuedTimestepCount <= iVar21) goto LAB_0073025a;
          CP_verbose(Stream,PerStepVerbose,"Blocking on QueueFull condition\n");
          pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,(pthread_mutex_t *)__mutex);
          iVar21 = Stream->QueueLimit;
        } while (0 < iVar21);
      }
    }
    pvStack_60 = (void *)0x0;
    local_78 = 0;
    local_98 = (_SstData *)0x0;
    pvStack_90 = (void *)0x0;
    local_a8 = 0;
    p_Stack_a0 = (_SstData *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8._4_4_ = 0;
    sStack_c0 = 0;
    if (p_Var22 != (RegisterQueue)0x0) {
      local_c8._4_4_ = 0;
      do {
        local_c8._4_4_ = local_c8._4_4_ + 1;
        p_Var22 = p_Var22->Next;
      } while (p_Var22 != (_RegisterQueue *)0x0);
    }
    local_c8 = CONCAT44(local_c8._4_4_,uVar23);
    local_88 = (ulong)(uint)Stream->ReleaseCount;
    p_Stack_80 = Stream->ReleaseList;
    local_68 = (ulong)(uint)Stream->LockDefnsCount;
    p_Stack_70 = Stream->LockDefnsList;
    iVar21 = Stream->ReaderCount;
    lVar27 = (long)iVar21;
    pvStack_60 = malloc(lVar27 * 4);
    local_78 = CONCAT44(local_78._4_4_,iVar21);
    if (0 < lVar27) {
      pp_Var5 = Stream->Readers;
      lVar18 = 0;
      do {
        *(StreamStatus *)((long)pvStack_60 + lVar18 * 4) = pp_Var5[lVar18]->ReaderStatus;
        lVar18 = lVar18 + 1;
      } while (lVar27 != lVar18);
    }
    pFVar14 = (FFSFormatList)0x0;
    Stream->ReleaseCount = 0;
    Stream->ReleaseList = (_ReleaseRec *)0x0;
    Stream->LockDefnsCount = 0;
    Stream->LockDefnsList = (_ReleaseRec *)0x0;
    iVar21 = Stream->CohortSize;
    lVar27 = (long)iVar21;
    uStack_b0 = CONCAT44(uStack_b0._4_4_,iVar21);
    local_b8 = Stream->WriterTimestep;
    p_Stack_a0 = (_SstData *)malloc(lVar27 << 4);
    local_98 = (_SstData *)malloc(lVar27 << 4);
    pvStack_90 = malloc(lVar27 * 8);
    iVar24 = 0;
    if (0 < lVar27) {
      lVar18 = 0;
      lVar27 = 0;
      iVar24 = 0;
      pFVar14 = (FFSFormatList)0x0;
      do {
        puVar6 = *__ptr_00[lVar27];
        puVar15 = (undefined4 *)((long)&p_Stack_a0->DataSize + lVar18);
        if (puVar6 == (undefined4 *)0x0) {
          uVar28 = 0;
          uVar29 = 0;
          uVar30 = 0;
          uVar31 = 0;
        }
        else {
          uVar28 = *puVar6;
          uVar29 = puVar6[1];
          uVar30 = puVar6[2];
          uVar31 = puVar6[3];
        }
        *puVar15 = uVar28;
        puVar15[1] = uVar29;
        puVar15[2] = uVar30;
        puVar15[3] = uVar31;
        puVar6 = *(undefined4 **)((long)__ptr_00[lVar27] + 8);
        puVar15 = (undefined4 *)((long)&local_98->DataSize + lVar18);
        if (puVar6 == (undefined4 *)0x0) {
          uVar28 = 0;
          uVar29 = 0;
          uVar30 = 0;
          uVar31 = 0;
        }
        else {
          uVar28 = *puVar6;
          uVar29 = puVar6[1];
          uVar30 = puVar6[2];
          uVar31 = puVar6[3];
        }
        *puVar15 = uVar28;
        puVar15[1] = uVar29;
        puVar15[2] = uVar30;
        puVar15[3] = uVar31;
        *(undefined8 *)((long)pvStack_90 + lVar27 * 8) =
             *(undefined8 *)((long)__ptr_00[lVar27] + 0x18);
        iVar24 = iVar24 + (uint)(*(long *)((long)__ptr_00[lVar27] + 0x18) == 0);
        pFVar14 = AddUniqueFormats(pFVar14,*(FFSFormatList *)((long)__ptr_00[lVar27] + 0x10),0);
        lVar27 = lVar27 + 1;
        iVar21 = Stream->CohortSize;
        lVar18 = lVar18 + 0x10;
      } while (lVar27 < iVar21);
    }
    if (iVar24 == iVar21) {
      free(pvStack_90);
      pvStack_90 = (void *)0x0;
    }
    if (Stream->AssembleMetadataUpcall == (AssembleMetadataUpcallFunc)0x0) {
      pvVar16 = (void *)0x0;
    }
    else {
      pvVar16 = (*Stream->AssembleMetadataUpcall)
                          (Stream->UpcallWriter,Stream->CohortSize,p_Stack_a0,local_98);
      iVar21 = Stream->CohortSize;
      if (1 < (long)iVar21) {
        lVar27 = 0x10;
        do {
          puVar3 = (undefined8 *)((long)&p_Stack_a0->DataSize + lVar27);
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar3 = (undefined8 *)((long)&local_98->DataSize + lVar27);
          *puVar3 = 0;
          puVar3[1] = 0;
          lVar27 = lVar27 + 0x10;
        } while ((long)iVar21 * 0x10 != lVar27);
      }
    }
    free(__ptr_00);
    pFVar14 = AddUniqueFormats(Stream->PreviousFormats,pFVar14,1);
    Stream->PreviousFormats = pFVar14;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    Metadata = (ReturnMetadataInfo)
               CP_distributeDataFromRankZero
                         (Stream,&local_c8,Stream->CPInfo->ReturnMetadataInfoFormat,&local_d0);
    if (Stream->FreeMetadataUpcall != (FreeMetadataUpcallFunc)0x0) {
      (*Stream->FreeMetadataUpcall)
                (Stream->UpcallWriter,RS_StreamPtr->Metadata,RS_StreamPtr->AttributeData,pvVar16);
    }
    free(pvStack_60);
    if (p_Stack_80 != (_ReleaseRec *)0x0) {
      free(p_Stack_80);
    }
    if (p_Stack_70 != (_ReleaseRec *)0x0) {
      free(p_Stack_70);
    }
    free(p_Stack_a0);
    free(local_98);
  }
  else {
    Metadata = (ReturnMetadataInfo)
               CP_distributeDataFromRankZero
                         (Stream,(void *)0x0,Stream->CPInfo->ReturnMetadataInfoFormat,&local_d0);
    pFVar14 = AddUniqueFormats(Stream->PreviousFormats,(Metadata->Msg).Formats,1);
    Stream->PreviousFormats = pFVar14;
  }
  free(local_58);
  iVar21 = Metadata->PendingReaderCount;
  RS_StreamPtr->DP_TimestepInfo = (Metadata->Msg).DP_TimestepInfo;
  p_Var10 = (Metadata->Msg).AttributeData;
  RS_StreamPtr->Metadata = (Metadata->Msg).Metadata;
  RS_StreamPtr->AttributeData = p_Var10;
  SVar11 = (Metadata->Msg).PreloadMode;
  pFVar14 = (Metadata->Msg).Formats;
  RS_StreamPtr->CohortSize = (Metadata->Msg).CohortSize;
  RS_StreamPtr->PreloadMode = SVar11;
  RS_StreamPtr->Formats = pFVar14;
  uVar28 = *(undefined4 *)((long)&(Metadata->Msg).RS_Stream + 4);
  sVar12 = (Metadata->Msg).Timestep;
  uVar29 = *(undefined4 *)((long)&(Metadata->Msg).Timestep + 4);
  *(undefined4 *)&RS_StreamPtr->RS_Stream = *(undefined4 *)&(Metadata->Msg).RS_Stream;
  *(undefined4 *)((long)&RS_StreamPtr->RS_Stream + 4) = uVar28;
  *(int *)&RS_StreamPtr->Timestep = (int)sVar12;
  *(undefined4 *)((long)&RS_StreamPtr->Timestep + 4) = uVar29;
  RS_StreamPtr->CohortSize = Stream->CohortSize;
  RS_StreamPtr->Timestep = Timestep;
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(SstInternalProvideTimestep::timerMD);
  }
  Entry->Msg = RS_StreamPtr;
  Entry->MetadataArray = RS_StreamPtr->Metadata;
  Entry->DP_TimestepInfo = RS_StreamPtr->DP_TimestepInfo;
  Entry->DataBlockToFree = local_d0;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  iVar24 = Metadata->ReaderCount;
  if (0 < iVar24) {
    uVar26 = 0;
    do {
      SVar4 = Stream->Readers[uVar26]->ReaderStatus;
      if (SVar4 != Metadata->ReaderStatus[uVar26]) {
        CP_verbose(Stream,PerRankVerbose,"Adjusting reader %d status from %s to %s\n",
                   uVar26 & 0xffffffff,SSTStreamStatusStr[SVar4],
                   SSTStreamStatusStr[Metadata->ReaderStatus[uVar26]]);
        CP_PeerFailCloseWSReader(Stream->Readers[uVar26],Metadata->ReaderStatus[uVar26]);
        iVar24 = Metadata->ReaderCount;
      }
      uVar26 = uVar26 + 1;
    } while ((long)uVar26 < (long)iVar24);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (0 < Metadata->LockDefnsCount) {
    lVar27 = 0;
    do {
      lVar18 = (long)Stream->ReaderCount;
      p_Var7 = Metadata->LockDefnsList;
      if (lVar18 < 1) {
        lVar20 = 0;
      }
      else {
        lVar19 = 0;
        do {
          lVar20 = lVar19;
          if (Stream->Readers[lVar19]->RankZeroID == p_Var7[lVar27].Reader) break;
          lVar19 = lVar19 + 1;
          lVar20 = lVar18;
        } while (lVar18 != lVar19);
      }
      Stream->Readers[lVar20]->FullCommPatternLocked = 1;
      CP_verbose(Stream,TraceVerbose,"LockDefns List, FOUND TS %zd\n",p_Var7[lVar27].Timestep);
      lVar27 = lVar27 + 1;
    } while (lVar27 < Metadata->LockDefnsCount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if ((Stream->ConfigParams->CPCommPattern == 0) && (Stream->Rank != 0)) {
    ProcessReleaseList(Stream,Metadata);
  }
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  iVar24 = Stream->ReaderCount;
  if (0 < iVar24) {
    uVar26 = 0;
    iVar25 = 0;
    do {
      p_Var17 = Stream->Readers[uVar26];
      if ((p_Var17->FullCommPatternLocked != 0) && (p_Var17->CommPatternLockTimestep == -1)) {
        local_c8 = 0;
        sStack_c0 = 0;
        p_Var17 = Stream->Readers[uVar26];
        p_Var17->CommPatternLockTimestep = Timestep;
        p_Var8 = Stream->DP_Interface->WSRreadPatternLocked;
        if (p_Var8 != (CP_DP_WSR_ReadPatternLockedFunc)0x0) {
          (*p_Var8)(&Svcs,p_Var17->DP_WSR_Stream,Timestep);
          p_Var17 = Stream->Readers[uVar26];
        }
        iVar25 = iVar25 + 1;
        sStack_c0 = Timestep;
        sendOneToWSRCohort(p_Var17,Stream->CPInfo->SharedCM->CommPatternLockedFormat,&local_c8,
                           (void **)&local_c8);
        p_Var17 = Stream->Readers[uVar26];
        p_Var17->PreloadMode = SstPreloadLearned;
        p_Var17->PreloadModeActiveTimestep = Timestep;
        CP_verbose(Stream,PerStepVerbose,
                   "Setting preload mode Learned for reader %d, active at timestep %zd\n",
                   uVar26 & 0xffffffff,Timestep);
        iVar24 = Stream->ReaderCount;
      }
      uVar26 = uVar26 + 1;
    } while ((long)uVar26 < (long)iVar24);
    if (iVar25 != 0) {
      CP_verbose(Stream,TraceVerbose,"Doing a barrier after notifying DP of preload mode changes\n")
      ;
      SMPI_Barrier(Stream->mpiComm);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (_perfstubs_initialized == 1) {
    if (SstInternalProvideTimestep::timerTS == (void *)0x0) {
      SstInternalProvideTimestep::timerTS = (void *)ps_timer_create_("provide timestep operations");
    }
    ps_timer_start_(SstInternalProvideTimestep::timerTS);
  }
  if (Metadata->DiscardThisTimestep != 0) {
    RS_StreamPtr->Metadata = (SstData)0x0;
    RS_StreamPtr->DP_TimestepInfo = (void **)0x0;
    CP_verbose(Stream,PerStepVerbose,
               "Sending Empty TimestepMetadata for Discarded timestep %ld, one to each reader\n",
               Timestep);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    sendOneToEachReaderRank
              (Stream,Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat,RS_StreamPtr,
               (void **)RS_StreamPtr);
    Entry->Expired = 1;
    Entry->ReferenceCount = 0;
    goto LAB_00730a74;
  }
  CP_verbose(Stream,PerStepVerbose,
             "Sending TimestepMetadata for timestep %ld (ref count %d), one to each reader\n",
             Timestep,(ulong)(uint)Entry->ReferenceCount);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  iVar24 = (int)extraout_RDX;
  sVar9 = Stream->ConfigParams->StepDistributionMode;
  p_Var17 = extraout_RDX;
  if (sVar9 == 2) {
LAB_007309f2:
    iVar24 = (int)p_Var17;
    if (Stream->ReaderCount != 0) {
      do {
        iVar24 = (int)p_Var17;
        __ptr = Stream->StepRequestQueue;
        if (__ptr == (StepRequest)0x0) goto LAB_00730a61;
        Stream->StepRequestQueue = __ptr->Next;
        iVar24 = __ptr->RequestingReader;
        free(__ptr);
        p_Var17 = Stream->Readers[iVar24];
      } while (p_Var17->ReaderStatus != Established);
      Stream->LastDemandTimestep = Entry->Timestep;
      SendTimestepEntryToSingleReader(Stream,Entry,p_Var17,iVar24);
      iVar24 = extraout_EDX_00;
      if ((Stream->CloseTimestepCount != 0xffffffffffffffff) &&
         (Stream->LastDemandTimestep == Stream->CloseTimestepCount)) {
        SendCloseMsgs(Stream);
        iVar24 = extraout_EDX_01;
      }
    }
  }
  else if (sVar9 == 1) {
    if ((long)Stream->ReaderCount != 0) {
      uVar26 = Stream->NextRRDistribution;
      if ((ulong)(long)Stream->ReaderCount <= uVar26) {
        Stream->NextRRDistribution = 0;
        uVar26 = 0;
      }
      CP_verbose(Stream,PerRankVerbose,"Round Robin Distribution, step sent to reader %ld\n",uVar26)
      ;
      SendTimestepEntryToSingleReader
                (Stream,Entry,Stream->Readers[Stream->NextRRDistribution],
                 (int)Stream->NextRRDistribution);
      Stream->NextRRDistribution = Stream->NextRRDistribution + 1;
      p_Var17 = extraout_RDX_00;
      goto LAB_007309f2;
    }
  }
  else if ((sVar9 == 0) && (0 < Stream->ReaderCount)) {
    lVar27 = 0;
    do {
      SendTimestepEntryToSingleReader(Stream,Entry,Stream->Readers[lVar27],(int)lVar27);
      lVar27 = lVar27 + 1;
      iVar24 = extraout_EDX;
    } while (lVar27 < Stream->ReaderCount);
  }
LAB_00730a61:
  Entry->InProgressFlag = 0;
  SubRefTimestep(Stream,Entry->Timestep,iVar24);
LAB_00730a74:
  QueueMaintenance(Stream);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (iVar21 != 0) {
    do {
      if (Stream->Rank == 0) {
        CP_verbose(Stream,SummaryVerbose,"Writer side ReaderLateArrival accepting incoming reader\n"
                  );
      }
      p_Var17 = WriterParticipateInReaderOpen(Stream);
      if (p_Var17 == (WS_ReaderInfo)0x0) {
        CP_error(Stream,"Potential reader registration failed\n");
        break;
      }
      if (Stream->ConfigParams->CPCommPattern == 1) {
        waitForReaderResponseAndSendQueued(p_Var17);
      }
      else if (Stream->Rank == 0) {
        waitForReaderResponseAndSendQueued(p_Var17);
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        local_c8 = CONCAT44(local_c8._4_4_,p_Var17->ReaderStatus);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        SMPI_Bcast(&local_c8,1,SMPI_INT,0,Stream->mpiComm);
      }
      else {
        SMPI_Bcast(&local_c8,1,SMPI_INT,0,Stream->mpiComm);
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        p_Var17->ReaderStatus = (StreamStatus)local_c8;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(SstInternalProvideTimestep::timerTS);
  }
  return;
}

Assistant:

extern void SstInternalProvideTimestep(SstStream Stream, SstData LocalMetadata, SstData Data,
                                       ssize_t Timestep, FFSFormatList Formats,
                                       DataFreeFunc FreeTimestep, void *FreeClientData,
                                       SstData AttributeData, DataFreeFunc FreeAttributeData,
                                       void *FreeAttributelientData)
{
    void *data_block1, *data_block2;
    MetadataPlusDPInfo *pointers;
    ReturnMetadataInfo ReturnData;
    struct _TimestepMetadataMsg *Msg = malloc(sizeof(*Msg));
    void *DP_TimestepInfo = NULL;
    struct _MetadataPlusDPInfo Md;
    CPTimestepList Entry = calloc(1, sizeof(struct _CPTimestepEntry));
    int PendingReaderCount = 0;

    memset(Msg, 0, sizeof(*Msg));
    STREAM_MUTEX_LOCK(Stream);
    Stream->WriterTimestep = Timestep;

    STREAM_MUTEX_UNLOCK(Stream);
    Stream->DP_Interface->provideTimestep(&Svcs, Stream->DP_Stream, Data, LocalMetadata, Timestep,
                                          &DP_TimestepInfo);
    if (Formats)
    {
        FFSFormatList tmp = Formats;
        while (tmp)
        {
            tmp = tmp->Next;
        }
    }
    STREAM_MUTEX_LOCK(Stream);

    /* Md is the local contribution to MetaData */
    Md.Formats = Formats;
    Md.Metadata = (SstData)LocalMetadata;
    Md.AttributeData = (SstData)AttributeData;
    Md.DP_TimestepInfo = DP_TimestepInfo;

    if (Data)
    {
        PERFSTUBS_SAMPLE_COUNTER("Timestep local data size", Data->DataSize);
    }
    if (LocalMetadata)
    {
        PERFSTUBS_SAMPLE_COUNTER("Timestep local metadata size", LocalMetadata->DataSize);
    }

    /* preliminary queue of message before metadata collection.  Timestep may
     * still be discarded.*/

    Stream->LastProvidedTimestep = Timestep;
    if (Stream->ConfigParams->FirstTimestepPrecious && (Timestep == 0))
    {
        Entry->PreciousTimestep = 1;
    }
    Entry->ReferenceCount = 1; /* holding one for us, so it doesn't disappear under us */
    Entry->DPRegistered = 1;
    Entry->Timestep = Timestep;
    Entry->Msg = Msg;
    Entry->MetadataArray = Msg->Metadata;
    Entry->DP_TimestepInfo = Msg->DP_TimestepInfo;
    Entry->FreeTimestep = FreeTimestep;
    Entry->FreeClientData = FreeClientData;
    Entry->Next = Stream->QueuedTimesteps;
    Entry->InProgressFlag = 1;

    Stream->QueuedTimesteps = Entry;
    Stream->QueuedTimestepCount++;
    Stream->Stats.TimestepsCreated++;
    /* no one waits on timesteps being added, so no condition signal to note
     * change */

    STREAM_MUTEX_UNLOCK(Stream);

    PERFSTUBS_TIMER_START(timerMD, "Metadata Consolidation time in EndStep()");
    pointers = (MetadataPlusDPInfo *)CP_consolidateDataToRankZero(
        Stream, &Md, Stream->CPInfo->PerRankMetadataFormat, &data_block1);

    if (Stream->Rank == 0)
    {
        int DiscardThisTimestep = 0;
        struct _ReturnMetadataInfo TimestepMetaData;
        RegisterQueue ArrivingReader;
        void *MetadataFreeValue;
        STREAM_MUTEX_LOCK(Stream);
        ArrivingReader = Stream->ReaderRegisterQueue;
        QueueMaintenance(Stream);
        if (Stream->QueueFullPolicy == SstQueueFullDiscard)
        {
            CP_verbose(Stream, TraceVerbose,
                       "Testing Discard Condition, Queued Timestep Count %d, "
                       "QueueLimit %d\n",
                       Stream->QueuedTimestepCount, Stream->QueueLimit);
            QueueMaintenance(Stream);
            if (Stream->QueuedTimestepCount > Stream->QueueLimit)
            {
                DiscardThisTimestep = 1;
            }
        }
        else
        {
            while ((Stream->QueueLimit > 0) && (Stream->QueuedTimestepCount > Stream->QueueLimit))
            {
                CP_verbose(Stream, PerStepVerbose, "Blocking on QueueFull condition\n");
                STREAM_CONDITION_WAIT(Stream);
            }
        }
        memset(&TimestepMetaData, 0, sizeof(TimestepMetaData));
        TimestepMetaData.PendingReaderCount = 0;
        while (ArrivingReader)
        {
            TimestepMetaData.PendingReaderCount++;
            ArrivingReader = ArrivingReader->Next;
        }

        TimestepMetaData.DiscardThisTimestep = DiscardThisTimestep;
        TimestepMetaData.ReleaseCount = Stream->ReleaseCount;
        TimestepMetaData.ReleaseList = Stream->ReleaseList;
        TimestepMetaData.LockDefnsCount = Stream->LockDefnsCount;
        TimestepMetaData.LockDefnsList = Stream->LockDefnsList;
        TimestepMetaData.ReaderStatus = malloc(sizeof(enum StreamStatus) * Stream->ReaderCount);
        TimestepMetaData.ReaderCount = Stream->ReaderCount;
        for (int i = 0; i < Stream->ReaderCount; i++)
        {
            TimestepMetaData.ReaderStatus[i] = Stream->Readers[i]->ReaderStatus;
        }
        Stream->ReleaseCount = 0;
        Stream->ReleaseList = NULL;
        Stream->LockDefnsCount = 0;
        Stream->LockDefnsList = NULL;
        MetadataFreeValue = FillMetadataMsg(Stream, &TimestepMetaData.Msg, pointers);
        STREAM_MUTEX_UNLOCK(Stream);
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &TimestepMetaData, Stream->CPInfo->ReturnMetadataInfoFormat, &data_block2);
        if (Stream->FreeMetadataUpcall)
        {
            Stream->FreeMetadataUpcall(Stream->UpcallWriter, Msg->Metadata, Msg->AttributeData,
                                       MetadataFreeValue);
        }
        free(TimestepMetaData.ReaderStatus);
        if (TimestepMetaData.ReleaseList)
            free(TimestepMetaData.ReleaseList);
        if (TimestepMetaData.LockDefnsList)
            free(TimestepMetaData.LockDefnsList);
        free(TimestepMetaData.Msg.Metadata);
        free(TimestepMetaData.Msg.AttributeData);
    }
    else
    {
        /* other ranks */
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->ReturnMetadataInfoFormat, &data_block2);
        Stream->PreviousFormats =
            AddUniqueFormats(Stream->PreviousFormats, ReturnData->Msg.Formats, /*copy*/ 1);
    }
    free(data_block1);
    PendingReaderCount = ReturnData->PendingReaderCount;
    *Msg = ReturnData->Msg;
    Msg->CohortSize = Stream->CohortSize;
    Msg->Timestep = Timestep;
    PERFSTUBS_TIMER_STOP(timerMD);

    /*
     * lock this Stream's data and queue the timestep
     */
    Entry->Msg = Msg;
    Entry->MetadataArray = Msg->Metadata;
    Entry->DP_TimestepInfo = Msg->DP_TimestepInfo;
    Entry->DataBlockToFree = data_block2;

    ProcessReaderStatusList(Stream, ReturnData);

    ProcessLockDefnsList(Stream, ReturnData);

    if ((Stream->ConfigParams->CPCommPattern == SstCPCommMin) && (Stream->Rank != 0))
    {
        ProcessReleaseList(Stream, ReturnData);
    }
    ActOnTSLockStatus(Stream, Timestep);
    PERFSTUBS_TIMER_START(timerTS, "provide timestep operations");
    if (ReturnData->DiscardThisTimestep)
    {
        /* Data was actually discarded, but we want to send a message to each
         * reader so that it knows a step was discarded, but actually so that we
         * get an error return if the write fails */

        Msg->Metadata = NULL;
        Msg->DP_TimestepInfo = NULL;

        CP_verbose(Stream, PerStepVerbose,
                   "Sending Empty TimestepMetadata for Discarded "
                   "timestep %ld, one to each reader\n",
                   Timestep);

        STREAM_MUTEX_LOCK(Stream);
        sendOneToEachReaderRank(Stream, Stream->CPInfo->SharedCM->DeliverTimestepMetadataFormat,
                                Msg, &Msg->RS_Stream);

        Entry->Expired = 1;
        Entry->ReferenceCount = 0;
        QueueMaintenance(Stream);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    else
    {

        CP_verbose(Stream, PerStepVerbose,
                   "Sending TimestepMetadata for timestep %ld (ref count "
                   "%d), one to each reader\n",
                   Timestep, Entry->ReferenceCount);

        STREAM_MUTEX_LOCK(Stream);
        SendTimestepEntryToReaders(Stream, Entry);
        Entry->InProgressFlag = 0;
        SubRefTimestep(Stream, Entry->Timestep, 0);
        QueueMaintenance(Stream);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    while (PendingReaderCount--)
    {
        WS_ReaderInfo reader;
        if (Stream->Rank == 0)
        {
            CP_verbose(Stream, SummaryVerbose,
                       "Writer side ReaderLateArrival accepting incoming reader\n");
        }
        reader = WriterParticipateInReaderOpen(Stream);
        if (!reader)
        {
            CP_error(Stream, "Potential reader registration failed\n");
            break;
        }
        if (Stream->ConfigParams->CPCommPattern == SstCPCommPeer)
        {
            waitForReaderResponseAndSendQueued(reader);
        }
        else
        {
            enum StreamStatus LocalStatus;
            if (Stream->Rank == 0)
            {
                waitForReaderResponseAndSendQueued(reader);
                STREAM_MUTEX_LOCK(Stream);
                LocalStatus = reader->ReaderStatus;
                STREAM_MUTEX_UNLOCK(Stream);
                SMPI_Bcast(&LocalStatus, 1, SMPI_INT, 0, Stream->mpiComm);
            }
            else
            {
                SMPI_Bcast(&LocalStatus, 1, SMPI_INT, 0, Stream->mpiComm);
                STREAM_MUTEX_LOCK(Stream);
                reader->ReaderStatus = LocalStatus;
                STREAM_MUTEX_UNLOCK(Stream);
            }
        }
    }
    PERFSTUBS_TIMER_STOP(timerTS);
}